

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O3

void __thiscall DeckBuilder::~DeckBuilder(DeckBuilder *this)

{
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  p_Var3 = (_List_node_base *)this->black;
  p_Var2 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var3->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != p_Var3) {
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)p_Var3,(char *)(p_Var2 + 1));
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_next + 0x18))();
    }
    p_Var3 = (_List_node_base *)this->black;
    p_Var2 = p_Var3->_M_next->_M_next;
  }
  p_Var2 = (_List_node_base *)this->green;
  p_Var4 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&p_Var2->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != p_Var2) {
    do {
      std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
                ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)p_Var2,(char *)(p_Var4 + 1));
      if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))();
      }
      p_Var2 = (_List_node_base *)this->green;
      p_Var4 = ((((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)p_Var2)->
                super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
                super__List_node_base._M_next)->_M_next;
    } while (p_Var4 != p_Var2);
    p_Var3 = (_List_node_base *)this->black;
    if (p_Var3 == (_List_node_base *)0x0) {
      p_Var3 = (_List_node_base *)0x0;
      goto LAB_00104d33;
    }
  }
  p_Var2 = p_Var3->_M_next;
  while (p_Var2 != p_Var3) {
    p_Var4 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var4;
  }
LAB_00104d33:
  operator_delete(p_Var3,0x18);
  plVar1 = this->green;
  if (plVar1 != (list<GreenCard_*,_std::allocator<GreenCard_*>_> *)0x0) {
    p_Var2 = (plVar1->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)plVar1) {
      p_Var3 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&p_Var2->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
      operator_delete(p_Var2,0x18);
      p_Var2 = p_Var3;
    }
  }
  operator_delete(plVar1,0x18);
  return;
}

Assistant:

DeckBuilder::~DeckBuilder()
{
	list<BlackCard *>::iterator it;
	list<GreenCard *>::iterator it2;

	for (it = black->begin(); it != black->end(); it++)
	{
		black->remove((*it));
		delete *it;
		it = black->begin();
	}
	for (it2 = green->begin(); it2 != green->end(); it2++)
	{
		green->remove((*it2));
		delete *it2;
		it2 = green->begin();
	}
	delete black;
	delete green;
}